

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPage::setCommitPage(QWizardPage *this,bool commitPage)

{
  QWizardPagePrivate *pQVar1;
  QWizardPrivate *this_00;
  QWizardPage *pQVar2;
  byte in_SIL;
  QWizardPage *in_RDI;
  QWizard *wizard;
  QWizardPagePrivate *d;
  QWizardPage *in_stack_ffffffffffffffe0;
  
  pQVar1 = d_func((QWizardPage *)0x7bd264);
  pQVar1->commit = (bool)(in_SIL & 1);
  this_00 = (QWizardPrivate *)QWizardPage::wizard(in_stack_ffffffffffffffe0);
  if (this_00 != (QWizardPrivate *)0x0) {
    pQVar2 = QWizard::currentPage((QWizard *)this_00);
    if (pQVar2 == in_RDI) {
      QWizard::d_func((QWizard *)0x7bd2ae);
      QWizardPrivate::updateCurrentPage(this_00);
    }
  }
  return;
}

Assistant:

void QWizardPage::setCommitPage(bool commitPage)
{
    Q_D(QWizardPage);
    d->commit = commitPage;
    QWizard *wizard = this->wizard();
    if (wizard && wizard->currentPage() == this)
        wizard->d_func()->updateCurrentPage();
}